

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLFileReader<fmt::File>::Read<SparsityPrinter>
          (NLFileReader<fmt::File> *this,CStringRef filename,SparsityPrinter *handler,int flags)

{
  char *pcVar1;
  undefined8 in_RSI;
  NLFileReader<fmt::File> *in_RDI;
  MemoryMappedFile<fmt::File> mapped_file;
  MemoryBuffer<char,_1UL,_std::allocator<char>_> array;
  int in_stack_00000124;
  SparsityPrinter *in_stack_00000128;
  CStringRef in_stack_00000130;
  undefined1 in_stack_00000138 [16];
  allocator<char> *in_stack_ffffffffffffff38;
  MemoryBuffer<char,_1UL,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  MemoryMappedFileBase *this_00;
  MemoryBuffer<char,_1UL,_std::allocator<char>_> *array_00;
  File *in_stack_ffffffffffffff58;
  MemoryMappedFile<fmt::File> *in_stack_ffffffffffffff60;
  MemoryMappedFileBase local_90;
  undefined8 local_80;
  NLFileReader<fmt::File> *in_stack_ffffffffffffff88;
  CStringRef in_stack_ffffffffffffff90;
  undefined1 local_51 [73];
  undefined8 local_8;
  
  local_8 = in_RSI;
  Open(in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  if (in_RDI->size_ == in_RDI->rounded_size_) {
    array_00 = (MemoryBuffer<char,_1UL,_std::allocator<char>_> *)local_51;
    std::allocator<char>::allocator();
    fmt::internal::MemoryBuffer<char,_1UL,_std::allocator<char>_>::MemoryBuffer
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::allocator<char>::~allocator((allocator<char> *)local_51);
    Read(in_RDI,array_00);
    pcVar1 = fmt::Buffer<char>::operator[]((Buffer<char> *)(local_51 + 1),0);
    NLStringRef::NLStringRef((NLStringRef *)&stack0xffffffffffffff88,pcVar1,in_RDI->size_);
    local_80 = local_8;
    ReadNLString<SparsityPrinter>
              ((NLStringRef)in_stack_00000138,in_stack_00000128,in_stack_00000130,in_stack_00000124)
    ;
    fmt::internal::MemoryBuffer<char,_1UL,_std::allocator<char>_>::~MemoryBuffer
              (in_stack_ffffffffffffff40);
  }
  else {
    this_00 = &local_90;
    MemoryMappedFile<fmt::File>::MemoryMappedFile
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(size_t)in_RDI);
    pcVar1 = MemoryMappedFileBase::start(this_00);
    NLStringRef::NLStringRef((NLStringRef *)&stack0xffffffffffffff60,pcVar1,in_RDI->size_);
    ReadNLString<SparsityPrinter>
              ((NLStringRef)in_stack_00000138,in_stack_00000128,in_stack_00000130,in_stack_00000124)
    ;
    MemoryMappedFile<fmt::File>::~MemoryMappedFile((MemoryMappedFile<fmt::File> *)0x12ed37);
  }
  return;
}

Assistant:

void Read(fmt::CStringRef filename, Handler &handler, int flags) {
    Open(filename);
    if (size_ == rounded_size_) {
      // Don't use mmap, because the file size is a multiple of the page size
      // and therefore the mmap'ed buffer won't be null-terminated.
      fmt::internal::MemoryBuffer<char, 1> array;
      Read(array);
      return ReadNLString(
            NLStringRef(&array[0], size_), handler, filename, flags);
    }
    MemoryMappedFile<File> mapped_file(file_, rounded_size_);
    ReadNLString(
          NLStringRef(mapped_file.start(), size_), handler, filename, flags);
  }